

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

QVariant * __thiscall
QPlainTextEdit::inputMethodQuery(QPlainTextEdit *this,InputMethodQuery query,QVariant *argument)

{
  bool bVar1;
  int iVar2;
  QPlainTextEditPrivate *pQVar3;
  QPoint QVar4;
  QVariant *in_RCX;
  int in_EDX;
  QRectF *pQVar5;
  qreal *pqVar6;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  qreal qVar7;
  QRect QVar8;
  QPointF QVar9;
  QPlainTextEditPrivate *d;
  QPointF offset;
  QVariant v;
  QPoint *in_stack_fffffffffffffd08;
  QPointF *in_stack_fffffffffffffd10;
  QPointF *in_stack_fffffffffffffd18;
  QPointF *in_stack_fffffffffffffd20;
  QPlainTextEdit *in_stack_fffffffffffffd28;
  undefined8 in_stack_fffffffffffffd30;
  InputMethodQuery query_00;
  QPlainTextEditControl *pQVar10;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  QRectF *in_stack_fffffffffffffd40;
  QRectF *this_00;
  QRect *in_stack_fffffffffffffd48;
  anon_union_24_3_e3d07ef4_for_data *this_01;
  byte local_299;
  QRect *local_268;
  QRect *local_230;
  undefined1 local_1b0 [64];
  undefined8 local_170;
  QPoint local_158;
  QPoint local_150;
  undefined1 local_148 [16];
  undefined8 local_138;
  qreal local_130;
  qreal local_128;
  qreal local_120;
  undefined1 local_118 [40];
  QPointF *local_f0;
  QPointF *local_e8;
  QPointF *local_e0;
  qreal local_d8;
  qreal qStack_d0;
  QRectF local_c8;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  undefined1 *puStack_90;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  query_00 = (InputMethodQuery)((ulong)in_stack_fffffffffffffd30 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QPlainTextEdit *)0x6c743f);
  if (in_EDX == 1) {
    bVar1 = QWidget::isEnabled((QWidget *)0x6c7496);
    local_299 = 0;
    if (bVar1) {
      bVar1 = isReadOnly((QPlainTextEdit *)in_stack_fffffffffffffd10);
      local_299 = bVar1 ^ 0xff;
    }
    ::QVariant::QVariant(in_RDI,(bool)(local_299 & 1));
  }
  else if ((in_EDX == 0x100) || (in_EDX == 0x8000)) {
    QWidget::inputMethodQuery
              ((QWidget *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),query_00);
  }
  else if (in_EDX == 0x10000) {
    bVar1 = isReadOnly((QPlainTextEdit *)in_stack_fffffffffffffd10);
    ::QVariant::QVariant(in_RDI,bVar1);
  }
  else {
    local_d8 = -NAN;
    qStack_d0 = -NAN;
    QVar9 = contentOffset(in_stack_fffffffffffffd28);
    qVar7 = QVar9.yp;
    local_d8 = QVar9.xp;
    qStack_d0 = qVar7;
    iVar2 = ::QVariant::userType((QVariant *)0x6c753f);
    switch(iVar2) {
    case 0x13:
      local_148 = ::QVariant::toRect();
      local_158 = QPointF::toPoint(in_stack_fffffffffffffd20);
      local_150 = ::operator-((QPoint *)in_stack_fffffffffffffd10);
      QVar8 = QRect::translated(in_stack_fffffffffffffd48,(QPoint *)in_stack_fffffffffffffd40);
      local_230 = QVar8._0_8_;
      ::QVariant::QVariant(&local_68,local_230);
      ::QVariant::operator=
                ((QVariant *)in_stack_fffffffffffffd18,(QVariant *)in_stack_fffffffffffffd10);
      ::QVariant::~QVariant(&local_68);
      break;
    case 0x14:
      ::QVariant::toRectF();
      QVar9 = ::operator-(in_stack_fffffffffffffd18);
      local_120 = QVar9.yp;
      local_128 = QVar9.xp;
      pQVar5 = (QRectF *)local_118;
      QRectF::translated(in_stack_fffffffffffffd40,
                         (QPointF *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      ::QVariant::QVariant(&local_28,pQVar5);
      ::QVariant::operator=((QVariant *)local_e8,(QVariant *)local_f0);
      ::QVariant::~QVariant(&local_28);
      in_stack_fffffffffffffd10 = local_f0;
      in_stack_fffffffffffffd18 = local_e8;
      in_stack_fffffffffffffd20 = local_e0;
      break;
    default:
      break;
    case 0x19:
      local_170 = ::QVariant::toPoint();
      QPointF::QPointF(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      pqVar6 = &local_d8;
      ::operator-(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      ::QVariant::QVariant(&local_88,(QPointF *)pqVar6);
      ::QVariant::operator=
                ((QVariant *)in_stack_fffffffffffffd18,(QVariant *)in_stack_fffffffffffffd10);
      ::QVariant::~QVariant(&local_88);
      break;
    case 0x1a:
      local_138 = ::QVariant::toPointF();
      pqVar6 = &local_d8;
      local_130 = qVar7;
      ::operator-(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      ::QVariant::QVariant(&local_48,(QPointF *)pqVar6);
      ::QVariant::operator=
                ((QVariant *)in_stack_fffffffffffffd18,(QVariant *)in_stack_fffffffffffffd10);
      ::QVariant::~QVariant(&local_48);
    }
    local_a8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar10 = pQVar3->control;
    this_00 = &local_c8;
    ::QVariant::QVariant((QVariant *)this_00,in_RCX);
    this_01 = &local_a8;
    (**(code **)(*(long *)&pQVar10->super_QWidgetTextControl + 0x90))
              (this_01,pQVar10,in_EDX,this_00);
    ::QVariant::~QVariant((QVariant *)this_00);
    iVar2 = ::QVariant::userType((QVariant *)0x6c7860);
    switch(iVar2) {
    case 0x13:
      ::QVariant::toRect();
      QPointF::toPoint(in_stack_fffffffffffffd20);
      QVar8 = QRect::translated((QRect *)this_01,(QPoint *)this_00);
      local_268 = QVar8._0_8_;
      ::QVariant::QVariant(in_RDI,local_268);
      break;
    case 0x14:
      ::QVariant::toRectF();
      pQVar5 = (QRectF *)local_1b0;
      QRectF::translated(this_00,(QPointF *)CONCAT44(in_EDX,in_stack_fffffffffffffd38));
      ::QVariant::QVariant(in_RDI,pQVar5);
      break;
    default:
      ::QVariant::QVariant(in_RDI,(QVariant *)local_a8.data);
      break;
    case 0x19:
      ::QVariant::toPoint();
      QPointF::toPoint(in_stack_fffffffffffffd20);
      QVar4 = ::operator+((QPoint *)in_stack_fffffffffffffd20,(QPoint *)in_stack_fffffffffffffd18);
      ::QVariant::QVariant(in_RDI,(QPoint *)QVar4);
      break;
    case 0x1a:
      ::QVariant::toPointF();
      pqVar6 = &local_d8;
      ::operator+(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
      ::QVariant::QVariant(in_RDI,(QPointF *)pqVar6);
    }
    ::QVariant::~QVariant((QVariant *)&local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QPlainTextEdit::inputMethodQuery(Qt::InputMethodQuery query, QVariant argument) const
{
    Q_D(const QPlainTextEdit);
    switch (query) {
    case Qt::ImEnabled:
        return isEnabled() && !isReadOnly();
    case Qt::ImHints:
    case Qt::ImInputItemClipRectangle:
        return QWidget::inputMethodQuery(query);
    case Qt::ImReadOnly:
        return isReadOnly();
    default:
        break;
    }

    const QPointF offset = contentOffset();
    switch (argument.userType()) {
    case QMetaType::QRectF:
        argument = argument.toRectF().translated(-offset);
        break;
    case QMetaType::QPointF:
        argument = argument.toPointF() - offset;
        break;
    case QMetaType::QRect:
        argument = argument.toRect().translated(-offset.toPoint());
        break;
    case QMetaType::QPoint:
        argument = argument.toPoint() - offset;
        break;
    default:
        break;
    }

    const QVariant v = d->control->inputMethodQuery(query, argument);
    switch (v.userType()) {
    case QMetaType::QRectF:
        return v.toRectF().translated(offset);
    case QMetaType::QPointF:
        return v.toPointF() + offset;
    case QMetaType::QRect:
        return v.toRect().translated(offset.toPoint());
    case QMetaType::QPoint:
        return v.toPoint() + offset.toPoint();
    default:
        break;
    }
    return v;
}